

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O0

int __thiscall ktx::CommandHelp::main(CommandHelp *this,int argc,char **argv)

{
  underlying_type_t<ktx::ReturnCode> uVar1;
  FatalError *error;
  exception *e;
  CommandHelp *in_stack_00000158;
  char **in_stack_00000250;
  int in_stack_0000025c;
  string *in_stack_00000260;
  string *in_stack_00000268;
  Command *in_stack_00000270;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [104];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Command::parseCommandLine
            (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_0000025c,
             in_stack_00000250);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  executeHelp(in_stack_00000158);
  uVar1 = ktx::operator+(SUCCESS);
  return uVar1;
}

Assistant:

int CommandHelp::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx help",
                "Displays the man page of a specific ktx command specified as the command argument."
                "\nIf the command option is missing the main ktx tool man page will be displayed.",
                argc, argv);
        executeHelp();
        return +rc::SUCCESS;
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}